

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

int __thiscall
WavingSketch<8U,_16U,_4U>::Bucket::Query
          (Bucket *this,Data<4U> *item,uint32_t seed_s,uint32_t seed_incast,bool only_heavy)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int *piVar4;
  Data<4U> *in_RSI;
  long in_RDI;
  byte in_R8B;
  uint32_t i;
  count_type retv;
  uint32_t whichcast;
  uint32_t choice;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_3c;
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  uint local_28;
  byte local_21;
  Data<4U> *local_18;
  
  local_21 = in_R8B & 1;
  local_18 = in_RSI;
  uVar3 = Data<4U>::Hash((Data<4U> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
  local_28 = uVar3 & 1;
  uVar3 = Data<4U>::Hash((Data<4U> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
  local_2c = uVar3 & 0xf;
  if ((local_21 & 1) == 1) {
    local_30 = 0;
  }
  else {
    local_34 = (int)*(short *)(in_RDI + 0x40 + (ulong)local_2c * 2) * COUNT[local_28];
    local_38 = 0;
    piVar4 = std::max<int>(&local_34,&local_38);
    local_30 = *piVar4;
  }
  local_3c = 0;
  while( true ) {
    if (7 < local_3c) {
      return local_30;
    }
    bVar2 = Data<4U>::operator==((Data<4U> *)(in_RDI + (ulong)local_3c * 4),local_18);
    if (bVar2) break;
    local_3c = local_3c + 1;
  }
  iVar1 = *(int *)(in_RDI + 0x20 + (ulong)local_3c * 4);
  if (0 < iVar1) {
    return iVar1;
  }
  return -iVar1;
}

Assistant:

int Query(const Data<DATA_LEN>& item, uint32_t seed_s, uint32_t seed_incast, bool only_heavy = false) {
			uint32_t choice = item.Hash(seed_s) & 1;
			uint32_t whichcast = item.Hash(seed_incast) % counter_num;
			count_type retv = (only_heavy == true) ? 0 : std::max(incast[whichcast] * COUNT[choice], 0);

			for (uint32_t i = 0; i < slot_num; ++i) {
				if (items[i] == item) {
					return std::abs(counters[i]);
				}
			}
			return retv;
		}